

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtUnionFind.cpp
# Opt level: O3

void __thiscall cbtUnionFind::reset(cbtUnionFind *this,int N)

{
  cbtElement *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [32];
  
  allocate(this,N);
  if (0 < N) {
    auVar6 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar7 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar8 = vpmovsxbd_avx512f(_DAT_009ec200);
    auVar12._8_4_ = 1;
    auVar12._0_8_ = 0x100000001;
    auVar12._12_4_ = 1;
    auVar12._16_4_ = 1;
    auVar12._20_4_ = 1;
    auVar12._24_4_ = 1;
    auVar12._28_4_ = 1;
    auVar9 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar10 = vpbroadcastd_avx512f(ZEXT416(0x10));
    pcVar1 = (this->m_elements).m_data;
    uVar4 = (ulong)(N + 0xfU & 0xfffffff0);
    auVar11 = vpbroadcastq_avx512f();
    do {
      uVar2 = vpcmpuq_avx512f(auVar7,auVar11,2);
      uVar3 = vpcmpuq_avx512f(auVar6,auVar11,2);
      auVar5 = vextracti64x4_avx512f(auVar8,1);
      uVar4 = uVar4 - 0x10;
      vpscatterqd_avx512f(ZEXT832(pcVar1) + auVar7._0_32_ * (undefined1  [32])0x8,uVar2,
                          auVar8._0_32_);
      auVar8 = vpaddd_avx512f(auVar8,auVar10);
      vpscatterqd_avx512f(ZEXT832(pcVar1) + auVar6._0_32_ * (undefined1  [32])0x8,uVar3,auVar5);
      vpscatterqd_avx512f(ZEXT832(pcVar1) + ZEXT832(4) + auVar7._0_32_ * (undefined1  [32])0x8,uVar2
                          ,auVar12);
      vpscatterqd_avx512f(ZEXT832(pcVar1) + ZEXT832(4) + auVar6._0_32_ * (undefined1  [32])0x8,uVar3
                          ,auVar12);
      auVar7 = vpaddq_avx512f(auVar7,auVar9);
      auVar6 = vpaddq_avx512f(auVar6,auVar9);
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void cbtUnionFind::reset(int N)
{
	allocate(N);

	for (int i = 0; i < N; i++)
	{
		m_elements[i].m_id = i;
		m_elements[i].m_sz = 1;
	}
}